

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void SobelXYRow_C(uint8_t *src_sobelx,uint8_t *src_sobely,uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  int32_t iVar3;
  int in_ECX;
  byte *in_RDX;
  long in_RSI;
  long in_RDI;
  int g;
  int b;
  int r;
  int i;
  int local_20;
  byte *local_18;
  
  local_18 = in_RDX;
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    bVar1 = *(byte *)(in_RDI + local_20);
    bVar2 = *(byte *)(in_RSI + local_20);
    iVar3 = libyuv::clamp255((uint)bVar1 + (uint)bVar2);
    *local_18 = bVar2;
    local_18[1] = (byte)iVar3;
    local_18[2] = bVar1;
    local_18[3] = 0xff;
    local_18 = local_18 + 4;
  }
  return;
}

Assistant:

void SobelXYRow_C(const uint8_t* src_sobelx,
                  const uint8_t* src_sobely,
                  uint8_t* dst_argb,
                  int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int r = src_sobelx[i];
    int b = src_sobely[i];
    int g = clamp255(r + b);
    dst_argb[0] = (uint8_t)(b);
    dst_argb[1] = (uint8_t)(g);
    dst_argb[2] = (uint8_t)(r);
    dst_argb[3] = (uint8_t)(255u);
    dst_argb += 4;
  }
}